

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicallyLoadTracerTest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  expected<opentracing::v3::DynamicTracingLibraryHandle,_std::error_code> tracerFactoryMaybe;
  string errorMessage;
  expected<opentracing::v3::DynamicTracingLibraryHandle,_std::error_code> local_68;
  string local_50;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  if (argc == 2) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    opentracing::v3::DynamicallyLoadTracingLibrary(&local_68,argv[1],&local_50);
    if (local_50._M_string_length == 0) {
      iVar2 = 0;
      if (local_68.has_value_ == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to load tracing library: ",0x20);
        if (local_68.has_value_ == true) {
          __assert_fail("! has_value()",
                        "/root/.hunter/_Base/d45d77d/2285c03/3b7ee27/Install/include/opentracing/expected/expected.hpp"
                        ,0x2cd,
                        "error_type &opentracing::expected<opentracing::DynamicTracingLibraryHandle>::error() & [T = opentracing::DynamicTracingLibraryHandle, E = std::error_code]"
                       );
        }
        (**(code **)(*(long *)local_68.contained.m_error._M_cat + 0x20))
                  (&local_30,local_68.contained.m_error._M_cat,
                   (ulong)local_68.contained.m_value.dynamic_library_handle_._M_t.
                          super___uniq_ptr_impl<opentracing::v3::DynamicLibraryHandle,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_opentracing::v3::DynamicLibraryHandle_*,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
                          .super__Head_base<0UL,_opentracing::v3::DynamicLibraryHandle_*,_false>.
                          _M_head_impl & 0xffffffff);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_30,local_28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        if (local_30 != local_20) {
          operator_delete(local_30);
        }
        iVar2 = -1;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to load tracing tracer: ",0x1f);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      iVar2 = -1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    }
    if (local_68.has_value_ == true) {
      if (local_68.contained.m_error._M_cat != (error_category *)0x0) {
        (**(code **)(*(long *)local_68.contained.m_error._M_cat + 8))();
      }
      local_68.contained.m_error._M_cat = (error_category *)0x0;
      if (local_68.contained.m_value.dynamic_library_handle_._M_t.
          super___uniq_ptr_impl<opentracing::v3::DynamicLibraryHandle,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_opentracing::v3::DynamicLibraryHandle_*,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
          .super__Head_base<0UL,_opentracing::v3::DynamicLibraryHandle_*,_false>._M_head_impl !=
          (__uniq_ptr_data<opentracing::v3::DynamicLibraryHandle,_std::default_delete<opentracing::v3::DynamicLibraryHandle>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_68.contained.m_value.dynamic_library_handle_._M_t.
                              super___uniq_ptr_impl<opentracing::v3::DynamicLibraryHandle,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::DynamicLibraryHandle_*,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
                              .super__Head_base<0UL,_opentracing::v3::DynamicLibraryHandle_*,_false>
                              ._M_head_impl + 8))();
      }
      local_68.contained.m_value.dynamic_library_handle_._M_t.
      super___uniq_ptr_impl<opentracing::v3::DynamicLibraryHandle,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
      ._M_t.
      super__Tuple_impl<0UL,_opentracing::v3::DynamicLibraryHandle_*,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
      .super__Head_base<0UL,_opentracing::v3::DynamicLibraryHandle_*,_false>._M_head_impl =
           (unique_ptr<opentracing::v3::DynamicLibraryHandle,_std::default_delete<opentracing::v3::DynamicLibraryHandle>_>
            )(__uniq_ptr_data<opentracing::v3::DynamicLibraryHandle,_std::default_delete<opentracing::v3::DynamicLibraryHandle>,_true,_true>
              )0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DynamicLoadTest <tracer-library>\n",0x21);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
    if (argc != 2) {
        std::cerr << "DynamicLoadTest <tracer-library>\n";
        return -1;
    }
    const char* library = argv[1];
    std::string errorMessage;
    auto tracerFactoryMaybe =
        opentracing::DynamicallyLoadTracingLibrary(library, errorMessage);
#ifdef JAEGERTRACING_WITH_YAML_CPP
    if (!errorMessage.empty()) {
        std::cerr << "Failed to load tracing tracer: " << errorMessage << "\n";
        return -1;
    }
    if (!tracerFactoryMaybe) {
        std::cerr << "Failed to load tracing library: "
                  << tracerFactoryMaybe.error().message() << "\n";
        return -1;
    }
#else
    if (tracerFactoryMaybe) {
        std::cerr << "Dynamically loading a tracing library should fail "
                     "without YAML support\n";
        return -1;
    }
#endif  // JAEGERTRACING_WITH_YAML_CPP
    return 0;
}